

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_eq(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *pBVar1;
  ulong uVar2;
  
  pBVar1 = btorsim_bv_new(1);
  if ((ulong)a->len != 0) {
    uVar2 = 0;
    do {
      if ((&a[1].width)[uVar2] != (&b[1].width)[uVar2]) {
        (&pBVar1[1].width)[pBVar1->len - 1] = (&pBVar1[1].width)[pBVar1->len - 1] & 0xfffffffe;
        return pBVar1;
      }
      uVar2 = uVar2 + 1;
    } while (a->len != uVar2);
  }
  (&pBVar1[1].width)[pBVar1->len - 1] = (&pBVar1[1].width)[pBVar1->len - 1] | 1;
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_eq (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;
  for (i = 0; i < a->len; i++)
  {
    if (a->bits[i] != b->bits[i])
    {
      bit = 0;
      break;
    }
  }
  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}